

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date.cpp
# Opt level: O1

ColumnRef __thiscall clickhouse::ColumnDateTime::Slice(ColumnDateTime *this,size_t begin,size_t len)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  long lVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  ColumnRef CVar5;
  shared_ptr<clickhouse::ColumnDateTime> result;
  ColumnDateTime *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_50 [2];
  long local_40;
  element_type *local_38;
  long local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  (**(code **)(**(long **)(begin + 0x28) + 0x38))(&local_30);
  std::__shared_ptr<clickhouse::Column,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<clickhouse::Column,void>
            ((__shared_ptr<clickhouse::Column,(__gnu_cxx::_Lock_policy)2> *)&local_58,
             (__weak_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2> *)(local_30 + 8));
  if (local_58 == (ColumnDateTime *)0x0) {
    lVar3 = 0;
  }
  else {
    lVar3 = __dynamic_cast(local_58,&Column::typeinfo,&ColumnVector<unsigned_int>::typeinfo,0);
  }
  if (lVar3 == 0) {
    lVar3 = 0;
    this_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    this_00._M_pi = a_Stack_50[0]._M_pi;
    if ((element_type *)a_Stack_50[0]._M_pi != (element_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&(((enable_shared_from_this<clickhouse::Column> *)
                  &(a_Stack_50[0]._M_pi)->_M_use_count)->_M_weak_this).
                 super___weak_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             *(int *)&(((enable_shared_from_this<clickhouse::Column> *)
                       &(a_Stack_50[0]._M_pi)->_M_use_count)->_M_weak_this).
                      super___weak_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
        UNLOCK();
      }
      else {
        *(int *)&(((enable_shared_from_this<clickhouse::Column> *)
                  &(a_Stack_50[0]._M_pi)->_M_use_count)->_M_weak_this).
                 super___weak_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             *(int *)&(((enable_shared_from_this<clickhouse::Column> *)
                       &(a_Stack_50[0]._M_pi)->_M_use_count)->_M_weak_this).
                      super___weak_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
      }
    }
  }
  if ((element_type *)a_Stack_50[0]._M_pi != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_50[0]._M_pi);
  }
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  local_58 = (ColumnDateTime *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<clickhouse::ColumnDateTime,std::allocator<clickhouse::ColumnDateTime>>
            (a_Stack_50,&local_58,(allocator<clickhouse::ColumnDateTime> *)&local_30);
  std::__shared_ptr<clickhouse::ColumnDateTime,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<clickhouse::ColumnDateTime,clickhouse::ColumnDateTime>
            ((__shared_ptr<clickhouse::ColumnDateTime,(__gnu_cxx::_Lock_policy)2> *)&local_58,
             local_58);
  peVar1 = (local_58->data_).
           super___shared_ptr<clickhouse::ColumnVector<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if ((element_type *)this_00._M_pi != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(((element_type *)this_00._M_pi)->super_enable_shared_from_this<clickhouse::Column>).
               _M_weak_this.super___weak_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = *(int *)&(((element_type *)this_00._M_pi)->
                      super_enable_shared_from_this<clickhouse::Column>)._M_weak_this.
                      super___weak_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
      UNLOCK();
    }
    else {
      *(int *)&(((element_type *)this_00._M_pi)->super_enable_shared_from_this<clickhouse::Column>).
               _M_weak_this.super___weak_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = *(int *)&(((element_type *)this_00._M_pi)->
                      super_enable_shared_from_this<clickhouse::Column>)._M_weak_this.
                      super___weak_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
    }
  }
  local_40 = lVar3;
  local_38 = (element_type *)this_00._M_pi;
  (*(peVar1->super_Column)._vptr_Column[2])(peVar1,&local_40);
  _Var4._M_pi = extraout_RDX;
  if (local_38 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38);
    _Var4._M_pi = extraout_RDX_00;
  }
  _Var2._M_pi = a_Stack_50[0]._M_pi;
  (this->super_Column).super_enable_shared_from_this<clickhouse::Column>._M_weak_this.
  super___weak_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  a_Stack_50[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_Column)._vptr_Column = (_func_int **)local_58;
  (this->super_Column).super_enable_shared_from_this<clickhouse::Column>._M_weak_this.
  super___weak_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var2._M_pi;
  if ((element_type *)this_00._M_pi != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
    _Var4._M_pi = extraout_RDX_01;
  }
  CVar5.super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  CVar5.super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &this->super_Column;
  return (ColumnRef)CVar5.super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ColumnRef ColumnDateTime::Slice(size_t begin, size_t len) {
    auto col = data_->Slice(begin, len)->As<ColumnUInt32>();
    auto result = std::make_shared<ColumnDateTime>();

    result->data_->Append(col);

    return result;
}